

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Edge(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_40;
  
  local_50 = 0;
  Extra_UtilGetoptReset();
  local_60 = 1;
  local_5c = 0;
  local_54 = 0;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
  bVar2 = false;
  local_40 = 1;
  local_58 = 0;
LAB_00285971:
  while (iVar6 = Extra_UtilGetopt(argc,argv,"CDFErpomdvh"), iVar7 = globalUtilOptind, 0x6c < iVar6)
  {
    switch(iVar6) {
    case 0x6d:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    default:
switchD_002859ce_caseD_6e:
      goto LAB_00285afa;
    case 0x6f:
      bVar5 = (bool)(bVar5 ^ 1);
      break;
    case 0x70:
      bVar4 = (bool)(bVar4 ^ 1);
      break;
    case 0x72:
      bVar3 = (bool)(bVar3 ^ 1);
      break;
    case 0x76:
      local_58 = local_58 ^ 1;
    }
  }
  switch(iVar6) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar9 = "Command line switch \"-C\" should be followed by a positive integer.\n";
LAB_00285aea:
      Abc_Print(-1,pcVar9);
      goto switchD_002859ce_caseD_6e;
    }
    local_50 = atoi(argv[globalUtilOptind]);
    break;
  case 0x44:
    if (argc <= globalUtilOptind) {
      pcVar9 = "Command line switch \"-D\" should be followed by a positive integer.\n";
      goto LAB_00285aea;
    }
    local_5c = atoi(argv[globalUtilOptind]);
    break;
  case 0x45:
    if (argc <= globalUtilOptind) {
      pcVar9 = "Command line switch \"-E\" should be followed by a positive integer.\n";
      goto LAB_00285aea;
    }
    local_60 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar7 + 1;
    if (local_60 - 3 < 0xfffffffe) {
      Abc_Print(-1,"Edge limit (%d) should be 1 or 2.\n",(ulong)local_60);
LAB_00285afa:
      Abc_Print(-2,"usage: &edge [-CDFE num] [-rpomdvh]\n");
      Abc_Print(-2,"\t           find edge assignment of the LUT-mapped network\n");
      Abc_Print(-2,"\t-C num   : the SAT solver conflict limit (0 = unused) [default = %d]\n",
                (ulong)local_50);
      Abc_Print(-2,"\t-D num   : the upper bound on delay [default = %d]\n",(ulong)local_5c);
      Abc_Print(-2,"\t-F num   : skip using edge if fanout higher than this [default = %d]\n",
                (ulong)local_54);
      Abc_Print(-2,"\t-E num   : the limit on the number of edges (1 <= num <= 2) [default = %d]\n",
                (ulong)local_60);
      pcVar10 = "yes";
      pcVar9 = "yes";
      if (!bVar3) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-r       : toggles using reverse order [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (!bVar4) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-p       : toggles deriving edges from packing [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (!bVar5) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-o       : toggles using old algorithm [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (!bVar2) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-m       : toggles combining edge assignment with mapping [default = %s]\n",
                pcVar9);
      pcVar9 = "yes";
      if (local_40 == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-d       : toggles dynamic addition of clauses [default = %s]\n",pcVar9);
      if (local_58 == 0) {
        pcVar10 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar10);
      pcVar9 = "\t-h       : prints the command usage\n";
      iVar7 = -2;
LAB_00285c4e:
      Abc_Print(iVar7,pcVar9);
      return 1;
    }
    goto LAB_00285971;
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar9 = "Command line switch \"-F\" should be followed by a positive integer.\n";
      goto LAB_00285aea;
    }
    local_54 = atoi(argv[globalUtilOptind]);
    break;
  default:
    if (iVar6 != 100) {
      if (iVar6 != -1) goto switchD_002859ce_caseD_6e;
      pGVar1 = pAbc->pGia;
      if (pGVar1 == (Gia_Man_t *)0x0) {
        pcVar9 = "Empty GIA network.\n";
      }
      else {
        if (bVar2) {
          Sle_ManExplore(pGVar1,local_50,local_5c,local_40,(uint)(local_60 == 2),local_58);
          return 0;
        }
        if (pGVar1->vMapping != (Vec_Int_t *)0x0) {
          iVar7 = Gia_ManLutSizeMax(pGVar1);
          if (6 < iVar7) {
            uVar8 = Gia_ManLutSizeMax(pAbc->pGia);
            Abc_Print(0,"Current AIG has mapping into %d-LUTs.\n",(ulong)uVar8);
            return 0;
          }
          if (bVar4) {
            if (pAbc->pGia->vPacking != (Vec_Int_t *)0x0) {
              Gia_ManConvertPackingToEdges(pAbc->pGia);
              return 0;
            }
            pcVar9 = "Packing information is not present.\n";
            iVar7 = -1;
          }
          else {
            pGVar1 = pAbc->pGia;
            if (!bVar5) {
              Seg_ManComputeDelay(pGVar1,local_5c,local_54,(uint)(local_60 == 2),local_58);
              return 0;
            }
            if (!bVar3 || pGVar1->pManTime == (void *)0x0) {
              if (bVar3) {
                Gia_ManComputeEdgeDelay2(pGVar1);
                return 0;
              }
              Gia_ManComputeEdgeDelay(pGVar1,(uint)(local_60 == 2));
              return 0;
            }
            pcVar9 = "Reverse computation does not work when boxes are present.\n";
            iVar7 = 0;
          }
          Abc_Print(iVar7,pcVar9);
          return 0;
        }
        pcVar9 = "Current AIG has no mapping. Run \"&if\".\n";
      }
      iVar7 = -1;
      goto LAB_00285c4e;
    }
    local_40 = local_40 ^ 1;
    goto LAB_00285971;
  }
  globalUtilOptind = iVar7 + 1;
  goto LAB_00285971;
}

Assistant:

int Abc_CommandAbc9Edge( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Edg_ManAssignEdgeNew( Gia_Man_t * p, int nEdges, int fVerbose );
    extern void Seg_ManComputeDelay( Gia_Man_t * pGia, int Delay, int nFanouts, int fTwo, int fVerbose );
    extern void Sle_ManExplore( Gia_Man_t * pGia, int nBTLimit, int DelayInit, int fDynamic, int fTwoEdges, int fVerbose );

    int c, nBTLimit = 0, DelayMax = 0, nFanouts = 0, nEdges = 1, fReverse = 0, fUsePack = 0, fUseOld = 0, fMapping = 0, fDynamic = 1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CDFErpomdvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'C':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nBTLimit = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                break;
            case 'D':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-D\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                DelayMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                break;
            case 'F':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nFanouts = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                break;
            case 'E':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-E\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nEdges = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nEdges != 1 && nEdges != 2 )
                {
                    Abc_Print( -1, "Edge limit (%d) should be 1 or 2.\n", nEdges );
                    goto usage;
                }
                break;
            case 'r':
                fReverse ^= 1;
                break;
            case 'p':
                fUsePack ^= 1;
                break;
            case 'o':
                fUseOld ^= 1;
                break;
            case 'm':
                fMapping ^= 1;
                break;
            case 'd':
                fDynamic ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
            default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }
    if ( fMapping )
    {
        Sle_ManExplore( pAbc->pGia, nBTLimit, DelayMax, fDynamic, nEdges==2, fVerbose );
        return 0;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Current AIG has no mapping. Run \"&if\".\n" );
        return 1;
    }
    if ( Gia_ManLutSizeMax(pAbc->pGia) > 6 )
    {
        Abc_Print( 0, "Current AIG has mapping into %d-LUTs.\n", Gia_ManLutSizeMax(pAbc->pGia) );
        return 0;
    }
    if ( fUsePack )
    {
        if ( pAbc->pGia->vPacking == NULL )
        {
            Abc_Print( -1, "Packing information is not present.\n" );
            return 0;
        }
        Gia_ManConvertPackingToEdges( pAbc->pGia );
        return 0;
    }
    if ( !fUseOld )
    {
        //Edg_ManAssignEdgeNew( pAbc->pGia, nEdges, fVerbose );
        Seg_ManComputeDelay( pAbc->pGia, DelayMax, nFanouts, nEdges==2, fVerbose );
        return 0;
    }
    if ( pAbc->pGia->pManTime && fReverse )
    {
        Abc_Print( 0, "Reverse computation does not work when boxes are present.\n" );
        return 0;
    }
    if ( fReverse )
        DelayMax = Gia_ManComputeEdgeDelay2( pAbc->pGia );
    else
        DelayMax = Gia_ManComputeEdgeDelay( pAbc->pGia, nEdges == 2 );
    //printf( "The number of edges = %d.  Delay = %d.\n", Gia_ManEvalEdgeCount(pAbc->pGia), DelayMax );
    return 0;

usage:
    Abc_Print( -2, "usage: &edge [-CDFE num] [-rpomdvh]\n" );
    Abc_Print( -2, "\t           find edge assignment of the LUT-mapped network\n" );
    Abc_Print( -2, "\t-C num   : the SAT solver conflict limit (0 = unused) [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-D num   : the upper bound on delay [default = %d]\n", DelayMax );
    Abc_Print( -2, "\t-F num   : skip using edge if fanout higher than this [default = %d]\n", nFanouts );
    Abc_Print( -2, "\t-E num   : the limit on the number of edges (1 <= num <= 2) [default = %d]\n", nEdges );
    Abc_Print( -2, "\t-r       : toggles using reverse order [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-p       : toggles deriving edges from packing [default = %s]\n", fUsePack? "yes": "no" );
    Abc_Print( -2, "\t-o       : toggles using old algorithm [default = %s]\n", fUseOld? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles combining edge assignment with mapping [default = %s]\n", fMapping? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles dynamic addition of clauses [default = %s]\n", fDynamic? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}